

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_ddd_open_list.hpp
# Opt level: O0

void __thiscall
astar_ddd::AstarDDDOpenList<Node<Tiles>_>::clear(AstarDDDOpenList<Node<Tiles>_> *this)

{
  unique_ptr<named_fstream,_std::default_delete<named_fstream>_> *in_RDI;
  nullptr_t in_stack_ffffffffffffffe8;
  
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::clear((vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           *)0x12982c);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::clear((vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           *)0x12983a);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::clear((vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           *)0x129848);
  std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>::operator=
            (in_RDI,in_stack_ffffffffffffffe8);
  rmdir("open_list_buckets");
  dfpair(_stdout,"max bucket size (bytes)","%lu",
         in_RDI[0x13]._M_t.super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>
         ._M_t.super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
         super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl);
  return;
}

Assistant:

void AstarDDDOpenList<Entry>::clear() {
        open_buckets.clear();
        next_buckets.clear();
        closed_buckets.clear();
        recursive_bucket = nullptr;
        // remove empty directory, this fails if directory is not empty
        rmdir("open_list_buckets");
        dfpair(stdout, "max bucket size (bytes)", "%lu", max_bucket_size_in_bytes);
    }